

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall Lowerer::GenerateFastInlineStringFromCharCode(Lowerer *this,Instr *instr)

{
  Opnd *pOVar1;
  StackSym *this_00;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  ArgSlot AVar5;
  undefined4 *puVar6;
  Instr *pIVar7;
  LabelInstr *labelFail;
  RegOpnd *pRVar8;
  LabelInstr *doneLabel;
  undefined1 local_58 [8];
  AutoReuseOpnd autoReuseFromCharCodeIntArgOpnd;
  RegOpnd *local_38;
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4dc9,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar3) goto LAB_005a1c0c;
    *puVar6 = 0;
  }
  autoReuseFromCharCodeIntArgOpnd._16_8_ = Inline::GetDefInstr(instr->m_src2);
  pOVar1 = ((Instr *)autoReuseFromCharCodeIntArgOpnd._16_8_)->m_src2;
  OVar4 = IR::Opnd::GetKind(pOVar1);
  if (OVar4 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar3) goto LAB_005a1c0c;
    *puVar6 = 0;
  }
  this_00 = (StackSym *)pOVar1[1]._vptr_Opnd;
  if ((this_00->super_Sym).m_kind != SymKindStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar3) goto LAB_005a1c0c;
    *puVar6 = 0;
  }
  AVar5 = StackSym::GetArgSlotNum(this_00);
  if (AVar5 != 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4dd8,"(argCount == 2)","argCount == 2");
    if (!bVar3) goto LAB_005a1c0c;
    *puVar6 = 0;
  }
  pIVar7 = Inline::GetDefInstr(pOVar1);
  if (pIVar7->m_opcode != ArgOut_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4ddc,"(argInstr->m_opcode == Js::OpCode::ArgOut_A)",
                       "argInstr->m_opcode == Js::OpCode::ArgOut_A");
    if (!bVar3) goto LAB_005a1c0c;
    *puVar6 = 0;
  }
  pOVar1 = pIVar7->m_src1;
  local_58._0_2_ = (pOVar1->m_valueType).field_0.bits;
  bVar3 = ValueType::IsLikelyInt((ValueType *)local_58);
  if (!bVar3) {
    return true;
  }
  OVar4 = IR::Opnd::GetKind(instr->m_dst);
  if ((OVar4 != OpndKindReg) || (bVar3 = IR::Opnd::IsEqual(instr->m_dst,pOVar1), bVar3)) {
    local_38 = IR::RegOpnd::New(TyVar,this->m_func);
  }
  else {
    local_38 = (RegOpnd *)instr->m_dst;
    OVar4 = IR::Opnd::GetKind((Opnd *)local_38);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) {
LAB_005a1c0c:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  labelFail = IR::LabelInstr::New(Label,this->m_func,true);
  pRVar8 = IR::RegOpnd::New(TyVar,instr->m_func);
  local_58 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_58,&pRVar8->super_Opnd,instr->m_func,true);
  InsertMove(&pRVar8->super_Opnd,pOVar1,instr,true);
  pRVar8 = GenerateUntagVar(this,pRVar8,labelFail,instr,true);
  doneLabel = IR::LabelInstr::New(Label,this->m_func,false);
  GenerateGetSingleCharString(this,pRVar8,&local_38->super_Opnd,labelFail,doneLabel,instr,false);
  IR::Instr::InsertBefore(instr,&labelFail->super_Instr);
  IR::Instr::InsertAfter(instr,&doneLabel->super_Instr);
  RelocateCallDirectToHelperPath
            ((Lowerer *)instr,(Instr *)autoReuseFromCharCodeIntArgOpnd._16_8_,labelFail);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_58);
  return true;
}

Assistant:

bool
Lowerer::GenerateFastInlineStringFromCharCode(IR::Instr* instr)
{
    Assert(instr->m_opcode == Js::OpCode::CallDirect);

//  ArgOut sequence
//  s8.var          =  StartCall      2 (0x2).i32                             #000c
//  arg1(s9)<0>.var =  ArgOut_A       s2.var, s8.var                          #0014 //Implicit this, String object
//  arg2(s10)<4>.var = ArgOut_A       s3.var, arg1(s9)<0>.var                 #0018 //First argument to FromCharCode
//  arg1(s11)<0>.u32 = ArgOut_A_InlineSpecialized  0x012C26C0 (DynamicObject).var, arg2(s10)<4>.var #
//  s0[LikelyTaggedInt].var = CallDirect  String_FromCharCode.u32, arg1(s11)<0>.u32 #001c

    IR::Opnd * linkOpnd = instr->GetSrc2();
    IR::Instr * tmpInstr = Inline::GetDefInstr(linkOpnd);// linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;
    linkOpnd = tmpInstr->GetSrc2();

#if DBG
    IntConstType argCount = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum();
    Assert(argCount == 2);
#endif

    IR::Instr *argInstr = Inline::GetDefInstr(linkOpnd);
    Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A);
    IR::Opnd *src1 = argInstr->GetSrc1();

    if (src1->GetValueType().IsLikelyInt())
    {
        //Trying to generate this code
        //      MOV resultOpnd, dst
        //      MOV fromCharCodeIntArgOpnd, src1
        //      SAR fromCharCodeIntArgOpnd, Js::VarTag_Shift
        //      JAE $Helper
        //      CMP fromCharCodeIntArgOpnd, Js::ScriptContext::CharStringCacheSize
        //
        //      JAE $labelWCharStringCheck                                   <
        //      MOV resultOpnd, GetCharStringCache[fromCharCodeIntArgOpnd]
        //      TST resultOpnd, resultOpnd          //Check for null
        //      JEQ $helper
        //      JMP $Done
        //
        //$labelWCharStringCheck:
        //      resultOpnd =  Call HelperGetStringForCharW
        //      JMP $Done
        //$helper:
        IR::RegOpnd * resultOpnd = nullptr;
        if (!instr->GetDst()->IsRegOpnd() || instr->GetDst()->IsEqual(src1))
        {
            resultOpnd = IR::RegOpnd::New(TyVar, this->m_func);
        }
        else
        {
            resultOpnd = instr->GetDst()->AsRegOpnd();
        }

        IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

        IR::RegOpnd * fromCharCodeIntArgOpnd = IR::RegOpnd::New(TyVar, instr->m_func);
        IR::AutoReuseOpnd autoReuseFromCharCodeIntArgOpnd(fromCharCodeIntArgOpnd, instr->m_func);
        InsertMove(fromCharCodeIntArgOpnd, src1, instr);

        //Check for tagged int and get the untagged version.
        fromCharCodeIntArgOpnd = GenerateUntagVar(fromCharCodeIntArgOpnd, labelHelper, instr);

        IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        GenerateGetSingleCharString(fromCharCodeIntArgOpnd, resultOpnd, labelHelper, doneLabel, instr, false);

        instr->InsertBefore(labelHelper);

        instr->InsertAfter(doneLabel);

        RelocateCallDirectToHelperPath(tmpInstr, labelHelper);
    }
    return true;
}